

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

void mserialize::CustomDeserializer<Person,_void>::deserialize(Person *p,InputStream *istream)

{
  bool bVar1;
  runtime_error *this;
  size_t in_RCX;
  char buffer [6];
  string foobar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  InputStream::read(istream,(int)buffer,(void *)0x6,in_RCX);
  foobar._M_dataplus._M_p = (pointer)&foobar.field_2;
  foobar.field_2._0_1_ = buffer[0];
  foobar.field_2._1_1_ = buffer[1];
  foobar.field_2._2_1_ = buffer[2];
  foobar.field_2._3_1_ = buffer[3];
  foobar.field_2._4_1_ = buffer[4];
  foobar.field_2._5_1_ = buffer[5];
  foobar._M_string_length = 6;
  foobar.field_2._M_local_buf[6] = '\0';
  bVar1 = std::operator!=(&foobar,"foobar");
  if (!bVar1) {
    detail::TrivialDeserializer<int>::deserialize<InputStream>(&p->age,istream);
    detail::
    BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::deserialize<InputStream>(&p->name,istream);
    std::__cxx11::string::~string((string *)&foobar);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Invalid magic: ",&foobar);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void deserialize(Person& p, InputStream& istream)
  {
    char buffer[6] = {0};
    istream.read(buffer, 6);
    const std::string foobar(buffer, 6);
    if (foobar != "foobar")
    {
      throw std::runtime_error("Invalid magic: " + foobar);
    }

    mserialize::deserialize(p.age, istream);
    mserialize::deserialize(p.name, istream);
  }